

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O1

void __thiscall QHttpMultiPartIODevice::~QHttpMultiPartIODevice(QHttpMultiPartIODevice *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR_metaObject_002d3560;
  pDVar1 = (this->partOffsets).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->partOffsets).d.d)->super_QArrayData,8,0x10);
    }
  }
  QIODevice::~QIODevice(&this->super_QIODevice);
  return;
}

Assistant:

QHttpMultiPartIODevice::~QHttpMultiPartIODevice()
    = default;